

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O2

FTexture * CELTexture_TryCreate(FileReader *file,int lumpnum)

{
  bool bVar1;
  FTexture *this;
  CELHeader header;
  CELHeader CStack_38;
  
  this = (FTexture *)0x0;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  bVar1 = anon_unknown.dwarf_842773::LoadCELHeader(file,&CStack_38);
  if (bVar1) {
    this = (FTexture *)operator_new(0xa8);
    FTexture::FTexture(this,(char *)0x0,lumpnum);
    this->_vptr_FTexture = (_func_int **)&PTR__FCELTexture_007e6730;
    this[1]._vptr_FTexture = (_func_int **)0x0;
    this[1].LeftOffset = 0;
    this[1].TopOffset = 0;
    this[1].WidthBits = '\0';
    this[1].HeightBits = '\0';
    *(undefined2 *)&this[1].field_0xe = 0;
    this->Width = CStack_38.width;
    this->Height = CStack_38.height;
    this->field_0x31 = this->field_0x31 | 8;
    FTexture::CalcBitSize(this);
  }
  return this;
}

Assistant:

FTexture* CELTexture_TryCreate(FileReader& file, int lumpnum)
{
	file.Seek(0, SEEK_SET);

	CELHeader header;

	if (!LoadCELHeader(file, header))
	{
		return NULL;
	}

	return new FCELTexture(lumpnum, header);
}